

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::emplace<QSocks5RevivedDatagram_const&>
          (QGenericArrayOps<QSocks5RevivedDatagram> *this,qsizetype i,QSocks5RevivedDatagram *args)

{
  QSocks5RevivedDatagram **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_a8;
  QSocks5RevivedDatagram tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size == i) {
      qVar5 = QArrayDataPointer<QSocks5RevivedDatagram>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<QSocks5RevivedDatagram>);
      if (qVar5 == 0) goto LAB_00223789;
      QSocks5RevivedDatagram::QSocks5RevivedDatagram
                ((this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr +
                 (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size,args);
LAB_002238a4:
      pqVar2 = &(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0022385d;
    }
LAB_00223789:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QSocks5RevivedDatagram>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<QSocks5RevivedDatagram>);
      if (qVar5 != 0) {
        QSocks5RevivedDatagram::QSocks5RevivedDatagram
                  ((this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr + -1,args);
        ppQVar1 = &(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_002238a4;
      }
    }
  }
  tmp._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.data.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.address.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  tmp.data.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.data.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QSocks5RevivedDatagram::QSocks5RevivedDatagram(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size != 0;
  QArrayDataPointer<QSocks5RevivedDatagram>::detachAndGrow
            (&this->super_QArrayDataPointer<QSocks5RevivedDatagram>,(uint)(i == 0 && bVar6),1,
             (QSocks5RevivedDatagram **)0x0,(QArrayDataPointer<QSocks5RevivedDatagram> *)0x0);
  if (i == 0 && bVar6) {
    QSocks5RevivedDatagram::QSocks5RevivedDatagram
              ((this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr + -1,&tmp);
    ppQVar1 = &(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_a8.sourceCopyConstruct = 0;
    local_a8.nSource = 0;
    local_a8.move = 0;
    local_a8.sourceCopyAssign = 0;
    local_a8.end = (QSocks5RevivedDatagram *)0x0;
    local_a8.last = (QSocks5RevivedDatagram *)0x0;
    local_a8.where = (QSocks5RevivedDatagram *)0x0;
    local_a8.begin = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
    local_a8.size = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
    local_a8.data = &this->super_QArrayDataPointer<QSocks5RevivedDatagram>;
    Inserter::insertOne(&local_a8,i,&tmp);
    (local_a8.data)->ptr = local_a8.begin;
    (local_a8.data)->size = local_a8.size;
  }
  QSocks5RevivedDatagram::~QSocks5RevivedDatagram(&tmp);
LAB_0022385d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }